

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 float64_to_floatx80_riscv64(float64 a,float_status *status)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  float64 a_00;
  undefined8 extraout_RDX;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  floatx80 fVar7;
  commonNaNT local_28;
  
  a_00 = float64_squash_input_denormal_riscv64(a,status);
  uVar5 = a_00 & 0xfffffffffffff;
  uVar3 = (uint)(a_00 >> 0x20);
  uVar6 = uVar3 >> 0x14 & 0x7ff;
  iVar2 = (int)uVar3 >> 0x1f;
  if (uVar6 == 0) {
    if (uVar5 == 0) {
      uVar4 = (ulong)(uint)(iVar2 * -0x8000);
      uVar5 = 0;
      goto LAB_00a83456;
    }
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar5 = uVar5 << ((byte)uVar3 & 0x3f);
    uVar6 = 1 - (uVar3 & 0xff);
  }
  else if (uVar6 == 0x7ff) {
    if (uVar5 == 0) {
      uVar4 = (ulong)(iVar2 * -0x8000 | 0x7fff);
      uVar5 = 0x8000000000000000;
    }
    else {
      uVar5 = 0xc000000000000000;
      float64ToCommonNaN(&local_28,a_00,status);
      uVar4 = CONCAT62((int6)((ulong)extraout_RDX >> 0x10),0xffff);
      if ((status->default_nan_mode == '\0') && (1 < local_28.high)) {
        uVar5 = local_28.high >> 1 | 0x8000000000000000;
        uVar4 = (ulong)(local_28._0_4_ << 0xf | 0x7fff);
      }
    }
    goto LAB_00a83456;
  }
  uVar5 = uVar5 << 0xb | 0x8000000000000000;
  uVar4 = (ulong)(iVar2 * -0x8000 + uVar6 + 0x3c00);
LAB_00a83456:
  fVar7._8_8_ = uVar4;
  fVar7.low = uVar5;
  return fVar7;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}